

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O1

void test_bitmap_of_32(void **param_1)

{
  _Bool _Var1;
  size_type in_RCX;
  size_type sVar2;
  initializer_list<unsigned_int> l;
  initializer_list<unsigned_int> l_00;
  initializer_list<unsigned_int> l_01;
  initializer_list<unsigned_int> l_02;
  Roaring r3a;
  Roaring r2;
  Roaring r1;
  Roaring r1d;
  undefined1 local_bc [20];
  undefined4 local_a8;
  roaring_array_t local_88;
  roaring_bitmap_t local_60;
  roaring_bitmap_t local_38;
  
  local_88.size = 1;
  local_88.allocation_size = 2;
  local_88.containers._0_4_ = 4;
  l._M_len = in_RCX;
  l._M_array = (iterator)0x3;
  roaring::Roaring::bitmapOfList((Roaring *)&local_60,(Roaring *)&local_88,l);
  roaring_bitmap_printf(&local_60);
  putchar(10);
  roaring::Roaring::bitmapOf((Roaring *)&local_88,3,1,2,4);
  roaring_bitmap_printf((roaring_bitmap_t *)&local_88);
  putchar(10);
  _Var1 = roaring_bitmap_equals(&local_60,(roaring_bitmap_t *)&local_88);
  _assert_true((ulong)_Var1,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x372);
  local_bc._12_8_ = 0x200000001;
  local_a8 = 4;
  l_01._M_len = 3;
  l_01._M_array = (iterator)(local_bc + 0xc);
  roaring::Roaring::Roaring((Roaring *)&local_38,l_01);
  _Var1 = roaring_bitmap_equals(&local_60,&local_38);
  sVar2 = 0x375;
  _assert_true((ulong)_Var1,"r1 == r1d",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x375);
  local_bc._0_4_ = 7;
  local_bc._4_4_ = 8;
  local_bc._8_4_ = 9;
  l_00._M_len = sVar2;
  l_00._M_array = (iterator)0x3;
  roaring::Roaring::bitmapOfList((Roaring *)(local_bc + 0xc),(Roaring *)local_bc,l_00);
  local_bc._0_4_ = 1;
  local_bc._4_4_ = 2;
  local_bc._8_4_ = 4;
  l_02._M_len = 3;
  l_02._M_array = (iterator)local_bc;
  roaring::Roaring::operator=((Roaring *)(local_bc + 0xc),l_02);
  _Var1 = roaring_bitmap_equals(&local_60,(roaring_bitmap_t *)(local_bc + 0xc));
  _assert_true((ulong)_Var1,"r1 == r3a",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x379);
  roaring::Roaring::~Roaring((Roaring *)(local_bc + 0xc));
  roaring::Roaring::~Roaring((Roaring *)&local_38);
  roaring::Roaring::~Roaring((Roaring *)&local_88);
  roaring::Roaring::~Roaring((Roaring *)&local_60);
  return;
}

Assistant:

DEFINE_TEST(test_bitmap_of_32) {
    Roaring r1 = Roaring::bitmapOfList({1, 2, 4});
    r1.printf();
    printf("\n");
    Roaring r2 = Roaring::bitmapOf(3, 1, 2, 4);
    r2.printf();
    printf("\n");
    assert_true(r1 == r2);

    Roaring r1d = {1, 2, 4};
    assert_true(r1 == r1d);

    Roaring r3a = Roaring::bitmapOfList({7, 8, 9});
    r3a = {1, 2, 4};  // overwrite with assignment operator
    assert_true(r1 == r3a);
}